

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
* transform(vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
            *__return_storage_ptr__,PatternList *pattern)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 *puVar2;
  pointer psVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  iterator __position;
  pointer psVar7;
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  groups;
  PatternList group;
  allocator_type local_99;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_98;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
  *local_80;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  local_78;
  shared_ptr<docopt::Pattern> local_58;
  vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
  local_48 [8];
  undefined8 local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        *)0x0;
  local_78.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        *)0x0;
  local_80 = (vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
              *)__return_storage_ptr__;
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
  ::
  emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
            ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
              *)&local_78,pattern);
  if (local_78.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           ((local_78.
             super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           ((local_78.
             super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_98.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           ((local_78.
             super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
      ((local_78.
        super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((local_78.
        super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((local_78.
        super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ::_M_erase(&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      psVar3 = local_98.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = (long)local_98.
                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      psVar7 = local_98.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (0 < lVar5) {
        psVar7 = (pointer)((long)&((local_98.
                                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr +
                          ((long)local_98.
                                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_98.
                                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffc0U));
        lVar5 = lVar5 + 1;
        __position._M_current =
             local_98.
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
        do {
          peVar1 = __position._M_current[-2].
                   super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar1 != (element_type *)0x0) &&
             (lVar4 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,
                                     &docopt::BranchPattern::typeinfo,0), lVar4 != 0)) {
            __position._M_current = __position._M_current + -2;
            goto LAB_0017fa0f;
          }
          peVar1 = __position._M_current[-1].
                   super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar1 != (element_type *)0x0) &&
             (lVar4 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,
                                     &docopt::BranchPattern::typeinfo,0), lVar4 != 0)) {
            __position._M_current = __position._M_current + -1;
            goto LAB_0017fa0f;
          }
          peVar1 = ((__position._M_current)->
                   super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if ((peVar1 != (element_type *)0x0) &&
             (lVar4 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,
                                     &docopt::BranchPattern::typeinfo,0), lVar4 != 0))
          goto LAB_0017fa0f;
          peVar1 = __position._M_current[1].
                   super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar1 != (element_type *)0x0) &&
             (lVar4 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,
                                     &docopt::BranchPattern::typeinfo,0), lVar4 != 0)) {
            __position._M_current = __position._M_current + 1;
            goto LAB_0017fa0f;
          }
          lVar5 = lVar5 + -1;
          __position._M_current = __position._M_current + 4;
        } while (1 < lVar5);
      }
      lVar5 = (long)psVar3 - (long)psVar7 >> 4;
      if (lVar5 == 1) {
LAB_0017f9c7:
        peVar1 = (psVar7->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        __position._M_current = psVar3;
        if ((peVar1 != (element_type *)0x0) &&
           (lVar5 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,
                                   &docopt::BranchPattern::typeinfo,0),
           __position._M_current = psVar7, lVar5 == 0)) {
          __position._M_current = psVar3;
        }
      }
      else if (lVar5 == 2) {
LAB_0017f99a:
        peVar1 = (psVar7->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar1 == (element_type *)0x0) ||
           (lVar5 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,
                                   &docopt::BranchPattern::typeinfo,0),
           __position._M_current = psVar7, lVar5 == 0)) {
          psVar7 = psVar7 + 1;
          goto LAB_0017f9c7;
        }
      }
      else {
        __position._M_current = psVar3;
        if ((lVar5 == 3) &&
           ((peVar1 = (psVar7->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr, peVar1 == (element_type *)0x0 ||
            (lVar5 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,
                                    &docopt::BranchPattern::typeinfo,0),
            __position._M_current = psVar7, lVar5 == 0)))) {
          psVar7 = psVar7 + 1;
          goto LAB_0017f99a;
        }
      }
LAB_0017fa0f:
      if (__position._M_current == psVar3) {
        std::
        vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
        ::
        emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                  (local_80,&local_98);
      }
      else {
        peVar1 = ((__position._M_current)->
                 super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this = ((__position._M_current)->
               super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        ((__position._M_current)->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = (element_type *)0x0;
        ((__position._M_current)->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::_M_erase(&local_98,__position);
        if (peVar1 == (element_type *)0x0) {
          lVar5 = 0;
        }
        else {
          lVar5 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,&docopt::Either::typeinfo,0);
        }
        if (lVar5 == 0) {
          if (peVar1 == (element_type *)0x0) {
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,&docopt::OneOrMore::typeinfo,0)
            ;
          }
          if (lVar5 == 0) {
            lVar5 = __dynamic_cast(peVar1,&docopt::Pattern::typeinfo,
                                   &docopt::BranchPattern::typeinfo,0);
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)local_48,
                     (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)(lVar5 + 8));
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      (local_48,local_40,
                       local_98.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_98.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            std::
            vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
            ::
            emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                      ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                        *)&local_78,
                       (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)local_48);
          }
          else {
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)local_48,
                     (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)(lVar5 + 8));
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      (local_48,local_40,*(undefined8 *)(lVar5 + 8),*(undefined8 *)(lVar5 + 0x10));
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      (local_48,local_40,
                       local_98.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_98.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            std::
            vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
            ::
            emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                      ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                        *)&local_78,
                       (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)local_48);
          }
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)local_48);
        }
        else {
          puVar2 = *(undefined8 **)(lVar5 + 0x10);
          for (puVar6 = *(undefined8 **)(lVar5 + 8); puVar6 != puVar2; puVar6 = puVar6 + 2) {
            local_58.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar6;
            local_58.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
            if (local_58.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_58.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_58.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_58.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_58.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            __l._M_len = 1;
            __l._M_array = &local_58;
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)local_48,__l,&local_99);
            if (local_58.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_58.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      (local_48,local_40,
                       local_98.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_98.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            std::
            vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
            ::
            emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                      ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                        *)&local_78,
                       (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)local_48);
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       *)local_48);
          }
        }
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
      }
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_98);
    } while (local_78.
             super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_78.
             super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ::~vector(&local_78);
  return (vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
          *)local_80;
}

Assistant:

std::vector<PatternList> transform(PatternList pattern)
{
	std::vector<PatternList> result;
	
	std::vector<PatternList> groups;
	groups.emplace_back(std::move(pattern));
	
	while(!groups.empty()) {
		// pop off the first element
		auto children = std::move(groups[0]);
		groups.erase(groups.begin());
		
		// find the first branch node in the list
		auto child_iter = std::find_if(children.begin(), children.end(), [](std::shared_ptr<Pattern> const& p) {
			return dynamic_cast<BranchPattern const*>(p.get());
		});
		
		// no branch nodes left : expansion is complete for this grouping
		if (child_iter == children.end()) {
			result.emplace_back(std::move(children));
			continue;
		}
		
		// pop the child from the list
		auto child = std::move(*child_iter);
		children.erase(child_iter);
		
		// expand the branch in the appropriate way
		if (Either* either = dynamic_cast<Either*>(child.get())) {
			// "[e] + children" for each child 'e' in Either
			for(auto const& eitherChild : either->children()) {
				PatternList group = { eitherChild };
				group.insert(group.end(), children.begin(), children.end());
				
				groups.emplace_back(std::move(group));
			}
		} else if (OneOrMore* oneOrMore = dynamic_cast<OneOrMore*>(child.get())) {
			// child.children * 2 + children
			auto const& subchildren = oneOrMore->children();
			PatternList group = subchildren;
			group.insert(group.end(), subchildren.begin(), subchildren.end());
			group.insert(group.end(), children.begin(), children.end());
			
			groups.emplace_back(std::move(group));
		} else { // Required, Optional, OptionsShortcut
			BranchPattern* branch = dynamic_cast<BranchPattern*>(child.get());
			
			// child.children + children
			PatternList group = branch->children();
			group.insert(group.end(), children.begin(), children.end());
			
			groups.emplace_back(std::move(group));
		}
	}
	
	return result;
}